

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

void __thiscall llvm::detail::IEEEFloat::initFromHalfAPInt(IEEEFloat *this,APInt *api)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint64_t *puVar5;
  integerPart *piVar6;
  uint32_t mysignificand;
  uint32_t myexponent;
  uint32_t i;
  APInt *api_local;
  IEEEFloat *this_local;
  
  uVar2 = APInt::getBitWidth(api);
  if (uVar2 != 0x10) {
    __assert_fail("api.getBitWidth()==16",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0xc7f,"void llvm::detail::IEEEFloat::initFromHalfAPInt(const APInt &)");
  }
  puVar5 = APInt::getRawData(api);
  uVar1 = *puVar5;
  uVar2 = (uint)uVar1;
  uVar3 = uVar2 >> 10 & 0x1f;
  initialize(this,(fltSemantics *)semIEEEhalf);
  uVar4 = partCount(this);
  if (uVar4 != 1) {
    __assert_fail("partCount()==1",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0xc85,"void llvm::detail::IEEEFloat::initFromHalfAPInt(const APInt &)");
  }
  this->field_0x12 = this->field_0x12 & 0xf7 | ((byte)(uVar2 >> 0xf) & 1) << 3;
  if ((uVar3 == 0) && ((uVar1 & 0x3ff) == 0)) {
    this->field_0x12 = this->field_0x12 & 0xf8 | 3;
  }
  else if ((uVar3 == 0x1f) && ((uVar1 & 0x3ff) == 0)) {
    this->field_0x12 = this->field_0x12 & 0xf8;
  }
  else if ((uVar3 == 0x1f) && ((uVar1 & 0x3ff) != 0)) {
    this->field_0x12 = this->field_0x12 & 0xf8 | 1;
    piVar6 = significandParts(this);
    *piVar6 = (ulong)(uVar2 & 0x3ff);
  }
  else {
    this->field_0x12 = this->field_0x12 & 0xf8 | 2;
    this->exponent = (short)uVar3 + -0xf;
    piVar6 = significandParts(this);
    *piVar6 = (ulong)(uVar2 & 0x3ff);
    if (uVar3 == 0) {
      this->exponent = -0xe;
    }
    else {
      piVar6 = significandParts(this);
      *piVar6 = *piVar6 | 0x400;
    }
  }
  return;
}

Assistant:

void IEEEFloat::initFromHalfAPInt(const APInt &api) {
  assert(api.getBitWidth()==16);
  uint32_t i = (uint32_t)*api.getRawData();
  uint32_t myexponent = (i >> 10) & 0x1f;
  uint32_t mysignificand = i & 0x3ff;

  initialize(&semIEEEhalf);
  assert(partCount()==1);

  sign = i >> 15;
  if (myexponent==0 && mysignificand==0) {
    // exponent, significand meaningless
    category = fcZero;
  } else if (myexponent==0x1f && mysignificand==0) {
    // exponent, significand meaningless
    category = fcInfinity;
  } else if (myexponent==0x1f && mysignificand!=0) {
    // sign, exponent, significand meaningless
    category = fcNaN;
    *significandParts() = mysignificand;
  } else {
    category = fcNormal;
    exponent = myexponent - 15;  //bias
    *significandParts() = mysignificand;
    if (myexponent==0)    // denormal
      exponent = -14;
    else
      *significandParts() |= 0x400; // integer bit
  }
}